

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void fix_diff_subtract(saucy *s,int cf,int *a,int *b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)cf;
  lVar4 = (s->right).clen[lVar3] + lVar3;
  for (lVar1 = lVar3; lVar2 = lVar3, lVar1 <= lVar4; lVar1 = lVar1 + 1) {
    s->stuff[a[lVar1]] = '\x01';
  }
  for (; lVar2 <= lVar4; lVar2 = lVar2 + 1) {
    if (s->stuff[b[lVar2]] == '\0') {
      add_diff(s,b[lVar2]);
    }
  }
  for (; lVar3 <= lVar4; lVar3 = lVar3 + 1) {
    s->stuff[a[lVar3]] = '\0';
  }
  return;
}

Assistant:

static void
fix_diff_subtract(struct saucy *s, int cf, const int *a, const int *b)
{
    int i, k;
    int cb = cf + s->right.clen[cf];

    /* Mark the contents of the first set */
    for (i = cf; i <= cb; ++i) {
        s->stuff[a[i]] = 1;
    }

    /* Add elements from second set not present in the first */
    for (i = cf; i <= cb; ++i) {
        k = b[i];
        if (!s->stuff[k]) add_diff(s, k);
    }

    /* Clear the marks of the first set */
    for (i = cf; i <= cb; ++i) {
        s->stuff[a[i]] = 0;
    }
}